

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSEngine.cpp
# Opt level: O0

void __thiscall PSEngine::load_next_level(PSEngine *this)

{
  allocator<char> local_69;
  string local_68;
  undefined1 local_48 [8];
  Operation op;
  int next_level_idx;
  PSEngine *this_local;
  
  op.loaded_game_title.field_2._12_4_ = (this->m_current_level).level_idx + 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"",&local_69);
  Operation::Operation((Operation *)local_48,LoadLevel,None,-1,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  op.operation_type = op.loaded_game_title.field_2._12_4_;
  std::vector<PSEngine::Operation,_std::allocator<PSEngine::Operation>_>::push_back
            (&this->m_operation_history,(value_type *)local_48);
  load_level_internal(this,op.loaded_game_title.field_2._12_4_);
  Operation::~Operation((Operation *)local_48);
  return;
}

Assistant:

void PSEngine::load_next_level()
{
    int next_level_idx = m_current_level.level_idx + 1;

    Operation op = Operation(OperationType::LoadLevel);
    op.loaded_level = next_level_idx;
    m_operation_history.push_back(op);

    load_level_internal(next_level_idx);
}